

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_and_handles.h
# Opt level: O2

string * Uint32ToHexString_abi_cxx11_(uint32_t val)

{
  string *in_RDI;
  uint local_c;
  
  to_hex<unsigned_int>(in_RDI,&local_c);
  return in_RDI;
}

Assistant:

inline std::string Uint32ToHexString(uint32_t val) { return to_hex(val); }